

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3StringAppend(StrBuffer *pStr,char *zAppend,int nAppend)

{
  size_t sVar1;
  sqlite3_uint64 n;
  char *pcVar2;
  char *zNew;
  sqlite3_int64 nAlloc;
  int nAppend_local;
  char *zAppend_local;
  StrBuffer *pStr_local;
  
  nAlloc._4_4_ = nAppend;
  if (nAppend < 0) {
    sVar1 = strlen(zAppend);
    nAlloc._4_4_ = (int)sVar1;
  }
  if (pStr->nAlloc <= pStr->n + nAlloc._4_4_ + 1) {
    n = (long)pStr->nAlloc + (long)nAlloc._4_4_ + 100;
    pcVar2 = (char *)sqlite3_realloc64(pStr->z,n);
    if (pcVar2 == (char *)0x0) {
      return 7;
    }
    pStr->z = pcVar2;
    pStr->nAlloc = (int)n;
  }
  memcpy(pStr->z + pStr->n,zAppend,(long)nAlloc._4_4_);
  pStr->n = nAlloc._4_4_ + pStr->n;
  pStr->z[pStr->n] = '\0';
  return 0;
}

Assistant:

static int fts3StringAppend(
  StrBuffer *pStr,                /* Buffer to append to */
  const char *zAppend,            /* Pointer to data to append to buffer */
  int nAppend                     /* Size of zAppend in bytes (or -1) */
){
  if( nAppend<0 ){
    nAppend = (int)strlen(zAppend);
  }

  /* If there is insufficient space allocated at StrBuffer.z, use realloc()
  ** to grow the buffer until so that it is big enough to accomadate the
  ** appended data.
  */
  if( pStr->n+nAppend+1>=pStr->nAlloc ){
    sqlite3_int64 nAlloc = pStr->nAlloc+(sqlite3_int64)nAppend+100;
    char *zNew = sqlite3_realloc64(pStr->z, nAlloc);
    if( !zNew ){
      return SQLITE_NOMEM;
    }
    pStr->z = zNew;
    pStr->nAlloc = nAlloc;
  }
  assert( pStr->z!=0 && (pStr->nAlloc >= pStr->n+nAppend+1) );

  /* Append the data to the string buffer. */
  memcpy(&pStr->z[pStr->n], zAppend, nAppend);
  pStr->n += nAppend;
  pStr->z[pStr->n] = '\0';

  return SQLITE_OK;
}